

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferBufferParameters.cpp
# Opt level: O0

GLboolean __thiscall
glcts::TextureBufferBufferParameters::queryBufferPointerv
          (TextureBufferBufferParameters *this,GLenum target,GLenum pname,GLvoid *expected_pointer)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar3;
  MessageBuilder local_1b8;
  GLboolean local_31;
  Functions *pFStack_30;
  GLboolean test_passed;
  GLvoid *result_pointer;
  Functions *gl;
  GLvoid *expected_pointer_local;
  GLenum pname_local;
  GLenum target_local;
  TextureBufferBufferParameters *this_local;
  
  gl = (Functions *)expected_pointer;
  expected_pointer_local._0_4_ = pname;
  expected_pointer_local._4_4_ = target;
  _pname_local = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  result_pointer = (GLvoid *)CONCAT44(extraout_var,iVar1);
  pFStack_30 = (Functions *)0x0;
  local_31 = '\x01';
  (**(code **)((long)result_pointer + 0x7b0))
            (expected_pointer_local._4_4_,(GLenum)expected_pointer_local,&stack0xffffffffffffffd0);
  err = (**(code **)((long)result_pointer + 0x800))();
  glu::checkError(err,"Could not get the mapped buffer\'s pointer using getBufferPointerv!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferBufferParameters.cpp"
                  ,0xb4);
  if (pFStack_30 != gl) {
    local_31 = '\0';
    this_00 = tcu::TestContext::getLog
                        ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1b8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1b8,(char (*) [30])"glGetBufferPointerv(pname == ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(uint *)&expected_pointer_local);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [20])") returned pointer ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&stack0xffffffffffffffd0);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [41])" which is not equal to expected pointer ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&gl);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2b6cb9a);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  }
  return local_31;
}

Assistant:

glw::GLboolean TextureBufferBufferParameters::queryBufferPointerv(glw::GLenum target, glw::GLenum pname,
																  glw::GLvoid* expected_pointer)
{
	/* Retrieve GLES entry points. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLvoid*   result_pointer = DE_NULL;
	glw::GLboolean test_passed	= true;

	gl.getBufferPointerv(target, pname, &result_pointer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not get the mapped buffer's pointer using getBufferPointerv!");

	if (result_pointer != expected_pointer)
	{
		test_passed = false;

		m_testCtx.getLog() << tcu::TestLog::Message << "glGetBufferPointerv(pname == " << pname << ") returned pointer "
						   << result_pointer << " which is not equal to expected pointer " << expected_pointer << "."
						   << tcu::TestLog::EndMessage;
	}

	return test_passed;
}